

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

char * opus_tags_query(OpusTags *_tags,char *_tag,int _count)

{
  int iVar1;
  char **ppcVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  int local_44;
  int ci;
  int ncomments;
  int found;
  size_t tag_len;
  char **user_comments;
  int _count_local;
  char *_tag_local;
  OpusTags *_tags_local;
  
  sVar4 = strlen(_tag);
  if (sVar4 < 0x80000000) {
    iVar1 = _tags->comments;
    ppcVar2 = _tags->user_comments;
    ci = 0;
    for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
      iVar3 = opus_tagncompare(_tag,(int)sVar4,ppcVar2[local_44]);
      if ((iVar3 == 0) && (bVar5 = _count == ci, ci = ci + 1, bVar5)) {
        return ppcVar2[local_44] + sVar4 + 1;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *opus_tags_query(const OpusTags *_tags,const char *_tag,int _count){
  char   **user_comments;
  size_t   tag_len;
  int      found;
  int      ncomments;
  int      ci;
  tag_len=strlen(_tag);
  if(OP_UNLIKELY(tag_len>(size_t)INT_MAX))return NULL;
  ncomments=_tags->comments;
  user_comments=_tags->user_comments;
  found=0;
  for(ci=0;ci<ncomments;ci++){
    if(!opus_tagncompare(_tag,(int)tag_len,user_comments[ci])){
      /*We return a pointer to the data, not a copy.*/
      if(_count==found++)return user_comments[ci]+tag_len+1;
    }
  }
  /*Didn't find anything.*/
  return NULL;
}